

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O0

void ihevc_sao_band_offset_luma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,WORD32 sao_band_pos,WORD8 *pi1_sao_offset,WORD32 wd,
               WORD32 ht)

{
  int iVar1;
  byte bVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 *in_R8;
  int in_R9D;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  WORD32 band_shift;
  char local_cc;
  int local_c4;
  int local_c0;
  int local_bc;
  int aiStack_b8 [18];
  WORD32 band_idx;
  WORD32 col;
  WORD32 row;
  WORD32 i;
  undefined4 local_30;
  int local_2c;
  int local_c;
  long local_8;
  
  for (local_c0 = 0; local_c0 < in_stack_00000018; local_c0 = local_c0 + 1) {
    *(undefined1 *)(in_RDX + local_c0) =
         *(undefined1 *)(in_RDI + (local_c0 * in_ESI + in_stack_00000010 + -1));
  }
  *in_R8 = *(undefined1 *)(in_RCX + (in_stack_00000010 + -1));
  for (local_c4 = 0; local_c4 < in_stack_00000010; local_c4 = local_c4 + 1) {
    *(undefined1 *)(in_RCX + local_c4) =
         *(undefined1 *)(in_RDI + ((in_stack_00000018 + -1) * in_ESI + local_c4));
  }
  local_30 = 3;
  for (local_bc = 0; local_bc < 0x20; local_bc = local_bc + 1) {
    aiStack_b8[local_bc] = 0;
  }
  local_2c = in_R9D;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
    aiStack_b8[(int)(local_bc + local_2c & 0x1f)] = local_bc + 1;
  }
  for (local_c0 = 0; local_c0 < in_stack_00000018; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < in_stack_00000010; local_c4 = local_c4 + 1) {
      bVar2 = (byte)local_30;
      iVar1 = aiStack_b8[(int)(uint)*(byte *)(local_8 + local_c4) >> (bVar2 & 0x1f)];
      if ((1 << (bVar2 + 5 & 0x1f)) + -1 <
          (int)((uint)*(byte *)(local_8 + local_c4) + (int)*(char *)(in_stack_00000008 + iVar1))) {
        local_cc = (char)(1 << (bVar2 + 5 & 0x1f)) + -1;
      }
      else if ((int)((uint)*(byte *)(local_8 + local_c4) + (int)*(char *)(in_stack_00000008 + iVar1)
                    ) < 0) {
        local_cc = '\0';
      }
      else {
        local_cc = *(char *)(local_8 + local_c4) + *(char *)(in_stack_00000008 + iVar1);
      }
      *(char *)(local_8 + local_c4) = local_cc;
    }
    local_8 = local_8 + local_c;
  }
  return;
}

Assistant:

void ihevc_sao_band_offset_luma(UWORD8 *pu1_src,
                                WORD32 src_strd,
                                UWORD8 *pu1_src_left,
                                UWORD8 *pu1_src_top,
                                UWORD8 *pu1_src_top_left,
                                WORD32 sao_band_pos,
                                WORD8 *pi1_sao_offset,
                                WORD32 wd,
                                WORD32 ht)
{
    WORD32 band_shift;
    WORD32 band_table[NUM_BAND_TABLE];
    WORD32 i;
    WORD32 row, col;

    /* Updating left and top and top-left */
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = pu1_src[row * src_strd + (wd - 1)];
    }
    pu1_src_top_left[0] = pu1_src_top[wd - 1];
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    band_shift = BIT_DEPTH_LUMA - 5;
    for(i = 0; i < NUM_BAND_TABLE; i++)
    {
        band_table[i] = 0;
    }
    for(i = 0; i < 4; i++)
    {
        band_table[(i + sao_band_pos) & 31] = i + 1;
    }

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            WORD32 band_idx;

            band_idx = band_table[pu1_src[col] >> band_shift];
            pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[band_idx], 0, (1 << (band_shift + 5)) - 1);
        }
        pu1_src += src_strd;
    }
}